

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

vector<duckdb::OpenFileInfo,_true> * __thiscall
duckdb::LocalFileSystem::Glob
          (vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr__,LocalFileSystem *this,
          string *path,FileOpener *opener)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  pointer pcVar5;
  undefined1 *puVar6;
  string *path_00;
  pointer pOVar7;
  bool bVar8;
  undefined4 uVar9;
  int iVar10;
  undefined8 extraout_RAX;
  idx_t iVar11;
  reference pvVar12;
  optional_idx oVar13;
  IOException *this_00;
  idx_t iVar14;
  iterator __begin5_1;
  pointer pbVar15;
  undefined1 *puVar16;
  pointer pOVar17;
  ulong uVar18;
  ulong uVar19;
  _Alloc_hider _Var20;
  uint uVar21;
  iterator __begin5;
  pointer pbVar22;
  undefined1 *puVar23;
  bool bVar24;
  bool bVar25;
  string home_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string search_paths_str;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  search_paths;
  _Alloc_hider in_stack_fffffffffffffdb8;
  _Alloc_hider _Var26;
  element_type *peStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  Val local_228 [2];
  undefined1 *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1f8;
  FileOpener *local_1e0;
  undefined1 local_1d8 [40];
  vector<duckdb::OpenFileInfo,_true> *local_1b0;
  undefined1 *local_1a8;
  string *local_1a0;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_198;
  undefined1 *local_180;
  OpenFileInfo local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  undefined8 local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  undefined8 local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  undefined1 *local_88;
  ulong local_80;
  undefined1 local_78 [16];
  LogicalType local_68;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  if (path->_M_string_length == 0) {
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_1f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = (path->_M_dataplus)._M_p;
  local_1e0 = opener;
  local_1b0 = __return_storage_ptr__;
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar4,pcVar4 + path->_M_string_length);
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"file:/","");
  puVar23 = local_50;
  if (local_80 < local_48) {
    local_200 = (undefined1 *)((ulong)local_200 & 0xffffffff00000000);
  }
  else {
    if (local_48 == 0) {
      uVar9 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      iVar10 = bcmp(local_50,local_88,local_48);
      uVar9 = CONCAT31((int3)((uint)iVar10 >> 8),iVar10 == 0);
    }
    local_200 = (undefined1 *)CONCAT44(local_200._4_4_,uVar9);
  }
  if (puVar23 != local_40) {
    operator_delete(puVar23);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  iVar11 = GetFileUrlOffset(path);
  uVar18 = path->_M_string_length;
  local_1a0 = path;
  if (iVar11 < uVar18) {
    iVar14 = 0;
    do {
      cVar3 = (local_1a0->_M_dataplus)._M_p[iVar11];
      if ((cVar3 == '\\') || (cVar3 == '/')) {
        if (iVar11 == iVar14) {
          iVar14 = iVar14 + 1;
        }
        else {
          if (local_1f8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_1f8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)local_1a0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdb8);
          }
          else {
            ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)local_1a0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdb8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffdb8._M_p != &local_238) {
            operator_delete(in_stack_fffffffffffffdb8._M_p);
          }
          iVar14 = iVar11 + 1;
          uVar18 = local_1a0->_M_string_length;
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < uVar18);
  }
  path_00 = local_1a0;
  ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)local_1a0);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffdb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdb8._M_p != &local_238) {
    operator_delete(in_stack_fffffffffffffdb8._M_p);
  }
  bVar8 = FileSystem::IsPathAbsolute(&this->super_FileSystem,path_00);
  bVar24 = true;
  if (!bVar8) {
    pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](&local_1f8,0);
    _Var20._M_p = (pointer)&local_238;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdb8,":","");
    oVar13 = StringUtil::Find((string *)pvVar12,(string *)&stack0xfffffffffffffdb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p != &local_238) {
      operator_delete(_Var20._M_p);
    }
    if (oVar13.index == 0xffffffffffffffff) {
      pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&local_1f8,0);
      iVar10 = ::std::__cxx11::string::compare((char *)pvVar12);
      if (iVar10 == 0) {
        FileSystem::GetHomeDirectory_abi_cxx11_((optional_ptr<duckdb::FileOpener,_true>)_Var20._M_p)
        ;
        if (peStack_240 == (element_type *)0x0) {
          bVar8 = true;
          bVar24 = false;
        }
        else {
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_1f8,0);
          ::std::__cxx11::string::_M_assign((string *)pvVar12);
          uVar18 = path_00->_M_string_length;
          if (uVar18 != 0) {
            bVar25 = true;
            uVar19 = 1;
            do {
              uVar21 = (byte)(path_00->_M_dataplus)._M_p[uVar19 - 1] - 0x2a;
              if ((uVar21 < 0x32) && ((0x2000000200001U >> ((ulong)uVar21 & 0x3f) & 1) != 0)) break;
              bVar25 = uVar19 < uVar18;
              bVar24 = uVar19 != uVar18;
              uVar19 = uVar19 + 1;
            } while (bVar24);
            bVar8 = true;
            bVar24 = true;
            if (bVar25) goto LAB_013ed658;
          }
          ::std::__cxx11::string::substr((ulong)local_1d8,(ulong)path_00);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_178,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffdb8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d8);
          (*(this->super_FileSystem)._vptr_FileSystem[0x19])(local_1b0,this,&local_178,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178.path._M_dataplus._M_p != &local_178.path.field_2) {
            operator_delete(local_178.path._M_dataplus._M_p);
          }
          if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
            operator_delete((void *)local_1d8._0_8_);
          }
          bVar24 = true;
          bVar8 = false;
        }
LAB_013ed658:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var20._M_p != &local_238) {
          operator_delete(_Var20._M_p);
        }
        if (!bVar8) goto LAB_013ee12c;
      }
      else {
        bVar24 = false;
      }
    }
  }
  uVar18 = path_00->_M_string_length;
  if (uVar18 != 0) {
    bVar8 = true;
    uVar19 = 1;
    do {
      uVar21 = (byte)(path_00->_M_dataplus)._M_p[uVar19 - 1] - 0x2a;
      if ((uVar21 < 0x32) && ((0x2000000200001U >> ((ulong)uVar21 & 0x3f) & 1) != 0)) break;
      bVar8 = uVar19 < uVar18;
      bVar25 = uVar19 != uVar18;
      uVar19 = uVar19 + 1;
    } while (bVar25);
    if (bVar8) {
      local_198.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar24) {
        pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&local_1f8,0);
        pcVar5 = (pvVar12->_M_dataplus)._M_p;
        local_c8 = &local_b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar5,pcVar5 + pvVar12->_M_string_length);
        _Var20._M_p = (pointer)local_c8;
        if (local_c8 == &local_b8) {
          local_238._8_8_ = local_b8._8_8_;
          _Var20._M_p = (pointer)&local_238;
        }
        local_238._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
        local_238._M_local_buf[0] = local_b8._M_local_buf[0];
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_228[0].bigint = 0;
        local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8 = &local_b8;
        std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
        emplace_back<duckdb::OpenFileInfo>
                  ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_198
                   ,(OpenFileInfo *)&stack0xfffffffffffffdb8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var20._M_p != &local_238) {
          operator_delete(_Var20._M_p);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
      }
      else {
        LogicalType::LogicalType(&local_68,SQLNULL);
        Value::Value((Value *)&stack0xfffffffffffffdb8,&local_68);
        LogicalType::~LogicalType(&local_68);
        if (local_1e0 != (FileOpener *)0x0) {
          paVar1 = &local_178.path.field_2;
          local_178.path._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"file_search_path","");
          iVar10 = (*local_1e0->_vptr_FileOpener[3])(local_1e0,&local_178,&stack0xfffffffffffffdb8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178.path._M_dataplus._M_p != paVar1) {
            operator_delete(local_178.path._M_dataplus._M_p);
          }
          if ((char)iVar10 != '\x03') {
            Value::ToString_abi_cxx11_((string *)local_1d8,(Value *)&stack0xfffffffffffffdb8);
            StringUtil::Split(&local_a0,(string *)local_1d8,',');
            if (local_a0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_a0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pbVar22 = local_a0.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pcVar5 = (pbVar22->_M_dataplus)._M_p;
                local_108 = &local_f8;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_108,pcVar5,pcVar5 + pbVar22->_M_string_length);
                if (local_108 == &local_f8) {
                  local_178.path.field_2._8_8_ = local_f8._8_8_;
                  local_178.path._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_178.path._M_dataplus._M_p = (pointer)local_108;
                }
                local_178.path.field_2._M_allocated_capacity._1_7_ =
                     local_f8._M_allocated_capacity._1_7_;
                local_178.path.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
                local_178.path._M_string_length = local_100;
                local_100 = 0;
                local_f8._M_local_buf[0] = '\0';
                local_178.extended_info.internal.
                super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_178.extended_info.internal.
                super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_108 = &local_f8;
                std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
                emplace_back<duckdb::OpenFileInfo>
                          ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                           &local_198,&local_178);
                if (local_178.extended_info.internal.
                    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_178.extended_info.internal.
                             super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178.path._M_dataplus._M_p != paVar1) {
                  operator_delete(local_178.path._M_dataplus._M_p);
                }
                if (local_108 != &local_f8) {
                  operator_delete(local_108);
                }
                pbVar22 = pbVar22 + 1;
              } while (pbVar22 !=
                       local_a0.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a0);
            if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
              operator_delete((void *)local_1d8._0_8_);
            }
          }
        }
        Value::~Value((Value *)&stack0xfffffffffffffdb8);
      }
      pbVar22 = local_1f8.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar15 = local_1f8.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_1f8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1f8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar18 = 0;
        do {
          iVar10 = ::std::__cxx11::string::compare((char *)pbVar15);
          uVar18 = uVar18 + (iVar10 == 0);
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar22);
        pbVar15 = local_1f8.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (1 < uVar18) {
          this_00 = (IOException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffdb8,"Cannot use multiple \'**\' in one path","")
          ;
          IOException::IOException(this_00,(string *)&stack0xfffffffffffffdb8);
          __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      local_a8 = (undefined1 *)(ulong)bVar24;
      puVar23 = &DAT_00000001;
      if ((char)local_200 == '\0') {
        puVar23 = local_a8;
      }
      puVar16 = (undefined1 *)
                ((long)pbVar15 -
                 (long)local_1f8.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (puVar23 < puVar16) {
        paVar2 = &local_e8.field_2;
        do {
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_1f8,(size_type)puVar23);
          pOVar7 = local_198.
                   super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar6 = puVar23 + 1;
          uVar18 = pvVar12->_M_string_length;
          local_200 = puVar23;
          local_1a8 = puVar6;
          local_180 = puVar16;
          if (uVar18 == 0) {
LAB_013edb85:
            local_1d8._16_8_ = (pointer)0x0;
            local_1d8._8_8_ = (pointer)0x0;
            local_1d8._0_8_ = (pointer)0x0;
            if (local_198.
                super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_198.
                super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[](&local_1f8,(size_type)puVar23);
              pcVar5 = (pvVar12->_M_dataplus)._M_p;
              local_128 = &local_118;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,pcVar5,pcVar5 + pvVar12->_M_string_length);
              _Var20._M_p = (pointer)local_128;
              if (local_128 == &local_118) {
                local_238._8_8_ = local_118._8_8_;
                _Var20._M_p = (pointer)&local_238;
              }
              local_238._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
              local_238._M_local_buf[0] = local_118._M_local_buf[0];
              local_120 = 0;
              local_118._M_local_buf[0] = '\0';
              local_228[0].bigint = 0;
              local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_128 = &local_118;
              std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
              emplace_back<duckdb::OpenFileInfo>
                        ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                         local_1d8,(OpenFileInfo *)&stack0xfffffffffffffdb8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var20._M_p != &local_238) {
                operator_delete(_Var20._M_p);
              }
              _Var20._M_p = (pointer)local_128;
              if (local_128 != &local_118) goto LAB_013edf39;
            }
            else {
              pOVar17 = local_198.
                        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (puVar6 == puVar16) {
                do {
                  pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[](&local_1f8,(size_type)local_200);
                  FileSystem::JoinPath
                            ((string *)&local_178,&this->super_FileSystem,(string *)pOVar17,
                             (string *)pvVar12);
                  iVar10 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])
                                     (this,&local_178,local_1e0);
                  if (((char)iVar10 != '\0') ||
                     (iVar10 = (*(this->super_FileSystem)._vptr_FileSystem[0xd])
                                         (this,&local_178,local_1e0), (char)iVar10 != '\0')) {
                    local_148 = &local_138;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_148,local_178.path._M_dataplus._M_p,
                               local_178.path._M_dataplus._M_p + local_178.path._M_string_length);
                    _Var20._M_p = (pointer)local_148;
                    if (local_148 == &local_138) {
                      local_238._8_8_ = local_138._8_8_;
                      _Var20._M_p = (pointer)&local_238;
                    }
                    local_238._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
                    local_238._M_local_buf[0] = local_138._M_local_buf[0];
                    local_140 = 0;
                    local_138._M_local_buf[0] = '\0';
                    local_228[0].bigint = 0;
                    local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                    ;
                    local_148 = &local_138;
                    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
                    emplace_back<duckdb::OpenFileInfo>
                              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                                *)local_1d8,(OpenFileInfo *)&stack0xfffffffffffffdb8);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_)
                      ;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var20._M_p != &local_238) {
                      operator_delete(_Var20._M_p);
                    }
                    if (local_148 != &local_138) {
                      operator_delete(local_148);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178.path._M_dataplus._M_p != &local_178.path.field_2) {
                    operator_delete(local_178.path._M_dataplus._M_p);
                  }
                  pOVar17 = pOVar17 + 1;
                } while (pOVar17 != pOVar7);
              }
              else {
                do {
                  pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[](&local_1f8,(size_type)puVar23);
                  FileSystem::JoinPath
                            (&local_e8,&this->super_FileSystem,(string *)pOVar17,(string *)pvVar12);
                  _Var26._M_p = local_e8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p == paVar2) {
                    local_238._8_8_ = local_e8.field_2._8_8_;
                    _Var26._M_p = (pointer)&local_238;
                  }
                  local_238._M_allocated_capacity._1_7_ =
                       local_e8.field_2._M_allocated_capacity._1_7_;
                  local_238._M_local_buf[0] = local_e8.field_2._M_local_buf[0];
                  local_e8._M_string_length = 0;
                  local_e8.field_2._M_local_buf[0] = '\0';
                  local_228[0].bigint = 0;
                  local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_e8._M_dataplus._M_p = (pointer)paVar2;
                  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
                  emplace_back<duckdb::OpenFileInfo>
                            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                             local_1d8,(OpenFileInfo *)&stack0xfffffffffffffdb8);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var26._M_p != &local_238) {
                    operator_delete(_Var26._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != paVar2) {
                    operator_delete(local_e8._M_dataplus._M_p);
                  }
                  pOVar17 = pOVar17 + 1;
                } while (pOVar17 != pOVar7);
              }
            }
          }
          else {
            bVar24 = true;
            uVar19 = 1;
            do {
              uVar21 = (byte)(pvVar12->_M_dataplus)._M_p[uVar19 - 1] - 0x2a;
              if ((uVar21 < 0x32) && ((0x2000000200001U >> ((ulong)uVar21 & 0x3f) & 1) != 0)) break;
              bVar24 = uVar19 < uVar18;
              bVar8 = uVar19 != uVar18;
              uVar19 = uVar19 + 1;
            } while (bVar8);
            local_1d8._0_8_ = (pointer)0x0;
            local_1d8._8_8_ = (pointer)0x0;
            local_1d8._16_8_ = (pointer)0x0;
            if (!bVar24) goto LAB_013edb85;
            pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&local_1f8,(size_type)puVar23);
            iVar10 = ::std::__cxx11::string::compare((char *)pvVar12);
            pOVar7 = local_198.
                     super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            puVar23 = local_200;
            if (iVar10 == 0) {
              if (puVar6 != puVar16) {
                ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
                operator=((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                          local_1d8,&local_198);
              }
              pOVar7 = local_198.
                       super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pOVar17 = local_198.
                        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_198.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_198.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                _Var20._M_p = (pointer)&local_238;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffdb8,".","");
                RecursiveGlobDirectories
                          (&this->super_FileSystem,(string *)&stack0xfffffffffffffdb8,
                           (vector<duckdb::OpenFileInfo,_true> *)local_1d8,local_1a8 != local_180,
                           false);
                goto LAB_013ee090;
              }
              do {
                RecursiveGlobDirectories
                          (&this->super_FileSystem,(string *)pOVar17,
                           (vector<duckdb::OpenFileInfo,_true> *)local_1d8,local_1a8 != local_180,
                           true);
                pOVar17 = pOVar17 + 1;
              } while (pOVar17 != pOVar7);
            }
            else {
              pOVar17 = local_198.
                        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_198.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_198.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[](&local_1f8,(size_type)puVar23);
                  GlobFilesInternal(&this->super_FileSystem,(string *)pOVar17,(string *)pvVar12,
                                    local_1a8 != local_180,
                                    (vector<duckdb::OpenFileInfo,_true> *)local_1d8,true);
                  pOVar17 = pOVar17 + 1;
                } while (pOVar17 != pOVar7);
                goto LAB_013edf3e;
              }
              _Var20._M_p = (pointer)&local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffdb8,".","");
              pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[](&local_1f8,(size_type)local_200);
              GlobFilesInternal(&this->super_FileSystem,(string *)&stack0xfffffffffffffdb8,
                                (string *)pvVar12,local_1a8 != local_180,
                                (vector<duckdb::OpenFileInfo,_true> *)local_1d8,false);
LAB_013ee090:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var20._M_p == &local_238) goto LAB_013edf3e;
LAB_013edf39:
              operator_delete(_Var20._M_p);
            }
          }
LAB_013edf3e:
          pOVar7 = local_198.
                   super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar23 = local_1a8;
          if (local_1d8._0_8_ == local_1d8._8_8_) {
            FetchFileWithoutGlob(local_1b0,this,local_1a0,local_1e0,SUB81(local_a8,0));
LAB_013ee115:
            ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                      ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                       local_1d8);
            goto LAB_013ee11f;
          }
          if (local_1a8 == local_180) {
            (local_1b0->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
            (local_1b0->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
            (local_1b0->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8._16_8_;
            local_1d8._0_8_ = (pointer)0x0;
            local_1d8._8_8_ = (pointer)0x0;
            local_1d8._16_8_ = (pointer)0x0;
            goto LAB_013ee115;
          }
          local_198.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8._16_8_;
          local_198.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
          local_198.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
          local_238._0_8_ = pOVar7;
          local_1d8._0_8_ = (pointer)0x0;
          local_1d8._8_8_ = (pointer)0x0;
          local_1d8._16_8_ = (pointer)0x0;
          ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                    ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                     &stack0xfffffffffffffdb8);
          ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                    ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                     local_1d8);
          puVar16 = (undefined1 *)
                    ((long)local_1f8.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1f8.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
        } while (puVar23 < puVar16);
      }
      (local_1b0->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_1b0->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_1b0->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_013ee11f:
      ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_198);
      goto LAB_013ee12c;
    }
  }
  FetchFileWithoutGlob(local_1b0,this,path_00,local_1e0,bVar24);
LAB_013ee12c:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  return local_1b0;
}

Assistant:

vector<OpenFileInfo> LocalFileSystem::Glob(const string &path, FileOpener *opener) {
	if (path.empty()) {
		return vector<OpenFileInfo>();
	}
	// split up the path into separate chunks
	vector<string> splits;

	bool is_file_url = StringUtil::StartsWith(path, "file:/");
	idx_t file_url_path_offset = GetFileUrlOffset(path);

	idx_t last_pos = 0;
	for (idx_t i = file_url_path_offset; i < path.size(); i++) {
		if (path[i] == '\\' || path[i] == '/') {
			if (i == last_pos) {
				// empty: skip this position
				last_pos = i + 1;
				continue;
			}
			if (splits.empty()) {
				//				splits.push_back(path.substr(file_url_path_offset, i-file_url_path_offset));
				splits.push_back(path.substr(0, i));
			} else {
				splits.push_back(path.substr(last_pos, i - last_pos));
			}
			last_pos = i + 1;
		}
	}
	splits.push_back(path.substr(last_pos, path.size() - last_pos));
	// handle absolute paths
	bool absolute_path = false;
	if (IsPathAbsolute(path)) {
		// first character is a slash -  unix absolute path
		absolute_path = true;
	} else if (StringUtil::Contains(splits[0], ":")) { // TODO: this is weird? shouldn't IsPathAbsolute handle this?
		// first split has a colon -  windows absolute path
		absolute_path = true;
	} else if (splits[0] == "~") {
		// starts with home directory
		auto home_directory = GetHomeDirectory(opener);
		if (!home_directory.empty()) {
			absolute_path = true;
			splits[0] = home_directory;
			D_ASSERT(path[0] == '~');
			if (!HasGlob(path)) {
				return Glob(home_directory + path.substr(1));
			}
		}
	}
	// Check if the path has a glob at all
	if (!HasGlob(path)) {
		// no glob: return only the file (if it exists or is a pipe)
		return FetchFileWithoutGlob(path, opener, absolute_path);
	}
	vector<OpenFileInfo> previous_directories;
	if (absolute_path) {
		// for absolute paths, we don't start by scanning the current directory
		previous_directories.push_back(splits[0]);
	} else {
		// If file_search_path is set, use those paths as the first glob elements
		Value value;
		if (opener && opener->TryGetCurrentSetting("file_search_path", value)) {
			auto search_paths_str = value.ToString();
			vector<std::string> search_paths = StringUtil::Split(search_paths_str, ',');
			for (const auto &search_path : search_paths) {
				previous_directories.push_back(search_path);
			}
		}
	}

	if (HasMultipleCrawl(splits)) {
		throw IOException("Cannot use multiple \'**\' in one path");
	}

	idx_t start_index;
	if (is_file_url) {
		start_index = 1;
	} else if (absolute_path) {
		start_index = 1;
	} else {
		start_index = 0;
	}

	for (idx_t i = start_index ? 1 : 0; i < splits.size(); i++) {
		bool is_last_chunk = i + 1 == splits.size();
		bool has_glob = HasGlob(splits[i]);
		// if it's the last chunk we need to find files, otherwise we find directories
		// not the last chunk: gather a list of all directories that match the glob pattern
		vector<OpenFileInfo> result;
		if (!has_glob) {
			// no glob, just append as-is
			if (previous_directories.empty()) {
				result.push_back(splits[i]);
			} else {
				if (is_last_chunk) {
					for (auto &prev_directory : previous_directories) {
						const string filename = JoinPath(prev_directory.path, splits[i]);
						if (FileExists(filename, opener) || DirectoryExists(filename, opener)) {
							result.push_back(filename);
						}
					}
				} else {
					for (auto &prev_directory : previous_directories) {
						result.push_back(JoinPath(prev_directory.path, splits[i]));
					}
				}
			}
		} else {
			if (IsCrawl(splits[i])) {
				if (!is_last_chunk) {
					result = previous_directories;
				}
				if (previous_directories.empty()) {
					RecursiveGlobDirectories(*this, ".", result, !is_last_chunk, false);
				} else {
					for (auto &prev_dir : previous_directories) {
						RecursiveGlobDirectories(*this, prev_dir.path, result, !is_last_chunk, true);
					}
				}
			} else {
				if (previous_directories.empty()) {
					// no previous directories: list in the current path
					GlobFilesInternal(*this, ".", splits[i], !is_last_chunk, result, false);
				} else {
					// previous directories
					// we iterate over each of the previous directories, and apply the glob of the current directory
					for (auto &prev_directory : previous_directories) {
						GlobFilesInternal(*this, prev_directory.path, splits[i], !is_last_chunk, result, true);
					}
				}
			}
		}
		if (result.empty()) {
			// no result found that matches the glob
			// last ditch effort: search the path as a string literal
			return FetchFileWithoutGlob(path, opener, absolute_path);
		}
		if (is_last_chunk) {
			return result;
		}
		previous_directories = std::move(result);
	}
	return vector<OpenFileInfo>();
}